

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

LaneArray<2> * __thiscall
wasm::Literal::getLanesI64x2(LaneArray<2> *__return_storage_ptr__,Literal *this)

{
  Literal *other;
  Literal *this_00;
  byte *pbVar1;
  long lVar2;
  byte *pbVar3;
  long lVar4;
  bool bVar5;
  array<unsigned_char,_16UL> aVar6;
  undefined1 local_58 [8];
  array<unsigned_char,_16UL> bytes;
  
  if ((this->type).id == 6) {
    aVar6 = getv128(this);
    pbVar3 = local_58;
    local_58[0] = aVar6._M_elems[0];
    local_58[1] = aVar6._M_elems[1];
    local_58[2] = aVar6._M_elems[2];
    local_58[3] = aVar6._M_elems[3];
    local_58[4] = aVar6._M_elems[4];
    local_58[5] = aVar6._M_elems[5];
    local_58[6] = aVar6._M_elems[6];
    local_58[7] = aVar6._M_elems[7];
    bytes._M_elems[0] = aVar6._M_elems[8];
    bytes._M_elems[1] = aVar6._M_elems[9];
    bytes._M_elems[2] = aVar6._M_elems[10];
    bytes._M_elems[3] = aVar6._M_elems[0xb];
    bytes._M_elems[4] = aVar6._M_elems[0xc];
    bytes._M_elems[5] = aVar6._M_elems[0xd];
    bytes._M_elems[6] = aVar6._M_elems[0xe];
    bytes._M_elems[7] = aVar6._M_elems[0xf];
    __return_storage_ptr__->_M_elems[0].field_0.i64 = 0;
    __return_storage_ptr__->_M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
    __return_storage_ptr__->_M_elems[0].type.id = 0;
    __return_storage_ptr__->_M_elems[1].field_0.i64 = 0;
    __return_storage_ptr__->_M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
    __return_storage_ptr__->_M_elems[1].type.id = 0;
    other = (Literal *)(bytes._M_elems + 8);
    lVar4 = 0;
    do {
      lVar2 = 0;
      bytes._M_elems._8_8_ = 0;
      pbVar1 = pbVar3;
      do {
        bytes._M_elems._8_8_ = bytes._M_elems._8_8_ | (ulong)*pbVar1 << ((byte)lVar2 & 0x3f);
        lVar2 = lVar2 + 8;
        pbVar1 = pbVar1 + 1;
      } while (lVar2 != 0x40);
      this_00 = __return_storage_ptr__->_M_elems + lVar4;
      if (this_00 != other) {
        ~Literal(this_00);
        Literal(this_00,other);
      }
      ~Literal(other);
      pbVar3 = pbVar3 + 8;
      bVar5 = lVar4 == 0;
      lVar4 = lVar4 + 1;
    } while (bVar5);
    return __return_storage_ptr__;
  }
  __assert_fail("val.type == Type::v128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x647,"LaneArray<Lanes> wasm::getLanes(const Literal &) [LaneT = long, Lanes = 2]")
  ;
}

Assistant:

LaneArray<2> Literal::getLanesI64x2() const {
  return getLanes<int64_t, 2>(*this);
}